

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void search_sgrproj(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                   RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  undefined4 uVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  uint8_t *src8;
  int64_t iVar7;
  long lVar8;
  uint uVar9;
  long in_RDX;
  int in_ESI;
  uint8_t *in_R8;
  undefined8 in_R9;
  double dVar10;
  SgrprojInfo SVar11;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int32_t *in_stack_00000020;
  int in_stack_00000028;
  aom_internal_error_info *in_stack_00000030;
  RestorationType rtype;
  double cost_sgr;
  double cost_none;
  int64_t bits_sgr;
  RestorationUnitInfo rui;
  int procunit_height;
  int procunit_width;
  int ss_y;
  int ss_x;
  int is_uv;
  uint8_t *src_start;
  uint8_t *dgd_start;
  int64_t bits_none;
  int bit_depth;
  int highbd;
  AV1_COMMON *cm;
  MACROBLOCK *x;
  RestUnitSearchInfo *rusi;
  RestSearchCtxt *rsc;
  RestorationUnitInfo *in_stack_000011a0;
  RestorationTileLimits *in_stack_000011a8;
  RestSearchCtxt *in_stack_000011b0;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea4;
  long local_140;
  bool local_126;
  bool local_125;
  double local_120;
  undefined8 local_c8;
  int local_c0;
  long lVar12;
  uint8_t *puVar13;
  
  src8 = (uint8_t *)(*(long *)(in_RDX + 0x30) + (long)in_ESI * 0x40);
  lVar12 = *(long *)(in_RDX + 0x18);
  lVar8 = *(long *)(in_RDX + 0x10);
  uVar1 = *(undefined4 *)(*(long *)(lVar8 + 0x6088) + 0x48);
  local_140 = (long)*(int *)(lVar12 + 0xb944);
  if (*(char *)(in_RDX + 0x78) == '\0') {
    bVar3 = 0 < *(int *)(in_RDX + 0x20);
    local_125 = false;
    if (bVar3) {
      local_125 = *(int *)(*(long *)(lVar8 + 0x6088) + 0x60) != 0;
    }
    local_126 = false;
    if (bVar3) {
      local_126 = *(int *)(*(long *)(lVar8 + 0x6088) + 100) != 0;
    }
    uVar9 = 0x40 >> local_125;
    uVar5 = 0x40 >> local_126;
    puVar13 = src8;
    SVar11 = search_selfguided_restoration
                       (in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9,(int)((ulong)in_RDX >> 0x20),
                        src8,(int)((ulong)lVar12 >> 0x20),unaff_retaddr,in_stack_00000008,
                        in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
                        in_stack_00000030);
    local_c8 = SVar11._0_8_;
    local_c0 = SVar11.xqd[1];
    *(undefined8 *)(src8 + 0x20) = local_c8;
    *(int *)(src8 + 0x28) = local_c0;
    iVar7 = try_restoration_unit(in_stack_000011b0,in_stack_000011a8,in_stack_000011a0);
    *(int64_t *)(in_RDX + 0x70) = iVar7;
    iVar2 = *(int *)(lVar12 + 0xb948);
    iVar6 = count_sgrproj_bits((SgrprojInfo *)CONCAT44(in_stack_fffffffffffffea4,uVar5),
                               (SgrprojInfo *)CONCAT44(in_stack_fffffffffffffe9c,uVar9));
    lVar8 = (long)(iVar2 + iVar6 * 0x200);
    cVar4 = (char)uVar1;
    dVar10 = (double)(*(long *)(in_RDX + 0x60) >> ((cVar4 + -8) * '\x02' & 0x3fU)) * 128.0 +
             ((double)(local_140 >> 4) * (double)*(int *)(lVar12 + 0x4218)) / 512.0;
    local_120 = (double)(*(long *)(in_RDX + 0x70) >> ((cVar4 + -8) * '\x02' & 0x3fU)) * 128.0 +
                ((double)(lVar8 >> 4) * (double)*(int *)(lVar12 + 0x4218)) / 512.0;
    if (*(int *)(puVar13 + 0x20) < 10) {
      local_120 = ((double)*(int *)(*(long *)(in_RDX + 0x38) + 0x14) * 0.01 + 1.0) * local_120;
    }
    uVar5 = 0;
    if (local_120 < dVar10) {
      uVar5 = 2;
    }
    *(uint *)(puVar13 + 0x30) = uVar5;
    *(long *)(in_RDX + 0x90) =
         *(long *)(in_RDX + 0x60 + (ulong)uVar5 * 8) + *(long *)(in_RDX + 0x90);
    if (local_120 < dVar10) {
      local_140 = lVar8;
    }
    *(long *)(in_RDX + 0xb0) = local_140 + *(long *)(in_RDX + 0xb0);
    if (local_120 < dVar10) {
      *(undefined8 *)(in_RDX + 0xe0) = *(undefined8 *)(puVar13 + 0x20);
      *(undefined4 *)(in_RDX + 0xe8) = *(undefined4 *)(puVar13 + 0x28);
    }
  }
  else {
    *(long *)(in_RDX + 0xb0) = local_140 + *(long *)(in_RDX + 0xb0);
    *(long *)(in_RDX + 0x90) = *(long *)(in_RDX + 0x60) + *(long *)(in_RDX + 0x90);
    src8[0x30] = '\0';
    src8[0x31] = '\0';
    src8[0x32] = '\0';
    src8[0x33] = '\0';
    *(undefined8 *)(in_RDX + 0x70) = 0x7fffffffffffffff;
  }
  return;
}

Assistant:

static inline void search_sgrproj(const RestorationTileLimits *limits,
                                  int rest_unit_idx, void *priv,
                                  int32_t *tmpbuf, RestorationLineBuffers *rlbs,
                                  struct aom_internal_error_info *error_info) {
  (void)rlbs;
  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;
  RestUnitSearchInfo *rusi = &rsc->rusi[rest_unit_idx];

  const MACROBLOCK *const x = rsc->x;
  const AV1_COMMON *const cm = rsc->cm;
  const int highbd = cm->seq_params->use_highbitdepth;
  const int bit_depth = cm->seq_params->bit_depth;

  const int64_t bits_none = x->mode_costs.sgrproj_restore_cost[0];
  // Prune evaluation of RESTORE_SGRPROJ if 'skip_sgr_eval' is set
  if (rsc->skip_sgr_eval) {
    rsc->total_bits[RESTORE_SGRPROJ] += bits_none;
    rsc->total_sse[RESTORE_SGRPROJ] += rsc->sse[RESTORE_NONE];
    rusi->best_rtype[RESTORE_SGRPROJ - 1] = RESTORE_NONE;
    rsc->sse[RESTORE_SGRPROJ] = INT64_MAX;
    return;
  }

  uint8_t *dgd_start =
      rsc->dgd_buffer + limits->v_start * rsc->dgd_stride + limits->h_start;
  const uint8_t *src_start =
      rsc->src_buffer + limits->v_start * rsc->src_stride + limits->h_start;

  const int is_uv = rsc->plane > 0;
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int ss_y = is_uv && cm->seq_params->subsampling_y;
  const int procunit_width = RESTORATION_PROC_UNIT_SIZE >> ss_x;
  const int procunit_height = RESTORATION_PROC_UNIT_SIZE >> ss_y;

  rusi->sgrproj = search_selfguided_restoration(
      dgd_start, limits->h_end - limits->h_start,
      limits->v_end - limits->v_start, rsc->dgd_stride, src_start,
      rsc->src_stride, highbd, bit_depth, procunit_width, procunit_height,
      tmpbuf, rsc->lpf_sf->enable_sgr_ep_pruning, error_info);

  RestorationUnitInfo rui;
  rui.restoration_type = RESTORE_SGRPROJ;
  rui.sgrproj_info = rusi->sgrproj;

  rsc->sse[RESTORE_SGRPROJ] = try_restoration_unit(rsc, limits, &rui);

  const int64_t bits_sgr =
      x->mode_costs.sgrproj_restore_cost[1] +
      (count_sgrproj_bits(&rusi->sgrproj, &rsc->ref_sgrproj)
       << AV1_PROB_COST_SHIFT);
  double cost_none = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_none >> 4, rsc->sse[RESTORE_NONE], bit_depth);
  double cost_sgr = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_sgr >> 4, rsc->sse[RESTORE_SGRPROJ], bit_depth);
  if (rusi->sgrproj.ep < 10)
    cost_sgr *=
        (1 + DUAL_SGR_PENALTY_MULT * rsc->lpf_sf->dual_sgr_penalty_level);

  RestorationType rtype =
      (cost_sgr < cost_none) ? RESTORE_SGRPROJ : RESTORE_NONE;
  rusi->best_rtype[RESTORE_SGRPROJ - 1] = rtype;

#if DEBUG_LR_COSTING
  // Store ref params for later checking
  lr_ref_params[RESTORE_SGRPROJ][rsc->plane][rest_unit_idx].sgrproj_info =
      rsc->ref_sgrproj;
#endif  // DEBUG_LR_COSTING

  rsc->total_sse[RESTORE_SGRPROJ] += rsc->sse[rtype];
  rsc->total_bits[RESTORE_SGRPROJ] +=
      (cost_sgr < cost_none) ? bits_sgr : bits_none;
  if (cost_sgr < cost_none) rsc->ref_sgrproj = rusi->sgrproj;
}